

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectools.hpp
# Opt level: O0

void vectools::shuffle<WorldTeleportTree*>
               (vector<WorldTeleportTree_*,_std::allocator<WorldTeleportTree_*>_> *vector,
               mt19937 *rng)

{
  bool bVar1;
  size_type sVar2;
  result_type rVar3;
  reference __args;
  reference __args_00;
  __normal_iterator<WorldTeleportTree_**,_std::vector<WorldTeleportTree_*,_std::allocator<WorldTeleportTree_*>_>_>
  local_78;
  WorldTeleportTree **local_70;
  __normal_iterator<WorldTeleportTree_**,_std::vector<WorldTeleportTree_*,_std::allocator<WorldTeleportTree_*>_>_>
  local_68;
  __normal_iterator<WorldTeleportTree_**,_std::vector<WorldTeleportTree_*,_std::allocator<WorldTeleportTree_*>_>_>
  local_60;
  const_iterator local_58;
  uint32_t local_3c;
  undefined1 local_38 [4];
  uint32_t random_pos;
  vector<WorldTeleportTree_*,_std::allocator<WorldTeleportTree_*>_> elems;
  anon_class_1_0_00000001 get_uniform_integer;
  mt19937 *rng_local;
  vector<WorldTeleportTree_*,_std::allocator<WorldTeleportTree_*>_> *vector_local;
  
  bVar1 = std::vector<WorldTeleportTree_*,_std::allocator<WorldTeleportTree_*>_>::empty(vector);
  if (!bVar1) {
    elems.super__Vector_base<WorldTeleportTree_*,_std::allocator<WorldTeleportTree_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    std::vector<WorldTeleportTree_*,_std::allocator<WorldTeleportTree_*>_>::vector
              ((vector<WorldTeleportTree_*,_std::allocator<WorldTeleportTree_*>_> *)local_38);
    while (sVar2 = std::vector<WorldTeleportTree_*,_std::allocator<WorldTeleportTree_*>_>::size
                             (vector), 1 < sVar2) {
      rVar3 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(rng);
      sVar2 = std::vector<WorldTeleportTree_*,_std::allocator<WorldTeleportTree_*>_>::size(vector);
      local_3c = shuffle<WorldTeleportTree_*>::anon_class_1_0_00000001::operator()
                           ((anon_class_1_0_00000001 *)
                            ((long)&elems.
                                    super__Vector_base<WorldTeleportTree_*,_std::allocator<WorldTeleportTree_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),
                            (uint32_t)rVar3,0,(int)sVar2 - 1);
      __args = std::vector<WorldTeleportTree_*,_std::allocator<WorldTeleportTree_*>_>::operator[]
                         (vector,(ulong)local_3c);
      std::vector<WorldTeleportTree*,std::allocator<WorldTeleportTree*>>::
      emplace_back<WorldTeleportTree*&>
                ((vector<WorldTeleportTree*,std::allocator<WorldTeleportTree*>> *)local_38,__args);
      local_68._M_current =
           (WorldTeleportTree **)
           std::vector<WorldTeleportTree_*,_std::allocator<WorldTeleportTree_*>_>::begin(vector);
      local_60 = __gnu_cxx::
                 __normal_iterator<WorldTeleportTree_**,_std::vector<WorldTeleportTree_*,_std::allocator<WorldTeleportTree_*>_>_>
                 ::operator+(&local_68,(ulong)local_3c);
      __gnu_cxx::
      __normal_iterator<WorldTeleportTree*const*,std::vector<WorldTeleportTree*,std::allocator<WorldTeleportTree*>>>
      ::__normal_iterator<WorldTeleportTree**>
                ((__normal_iterator<WorldTeleportTree*const*,std::vector<WorldTeleportTree*,std::allocator<WorldTeleportTree*>>>
                  *)&local_58,&local_60);
      local_70 = (WorldTeleportTree **)
                 std::vector<WorldTeleportTree_*,_std::allocator<WorldTeleportTree_*>_>::erase
                           (vector,local_58);
    }
    local_78._M_current =
         (WorldTeleportTree **)
         std::vector<WorldTeleportTree_*,_std::allocator<WorldTeleportTree_*>_>::begin(vector);
    __args_00 = __gnu_cxx::
                __normal_iterator<WorldTeleportTree_**,_std::vector<WorldTeleportTree_*,_std::allocator<WorldTeleportTree_*>_>_>
                ::operator*(&local_78);
    std::vector<WorldTeleportTree*,std::allocator<WorldTeleportTree*>>::
    emplace_back<WorldTeleportTree*&>
              ((vector<WorldTeleportTree*,std::allocator<WorldTeleportTree*>> *)local_38,__args_00);
    std::vector<WorldTeleportTree_*,_std::allocator<WorldTeleportTree_*>_>::operator=
              (vector,(vector<WorldTeleportTree_*,_std::allocator<WorldTeleportTree_*>_> *)local_38)
    ;
    std::vector<WorldTeleportTree_*,_std::allocator<WorldTeleportTree_*>_>::~vector
              ((vector<WorldTeleportTree_*,_std::allocator<WorldTeleportTree_*>_> *)local_38);
  }
  return;
}

Assistant:

inline void shuffle(std::vector<T>& vector, std::mt19937& rng)
    {
        if (vector.empty())
            return;

        auto get_uniform_integer = [](uint32_t number, uint32_t range_low, uint32_t range_high) -> uint32_t
        {
            double proportion = static_cast<double>(number) / (1.0 + UINT32_MAX);
            uint32_t range = range_high - range_low + 1;
            return static_cast<uint32_t>(proportion * range) + range_low;
        };

        std::vector<T> elems;

        while (vector.size() > 1)
        {
            uint32_t random_pos = get_uniform_integer(rng(), 0, static_cast<uint32_t>(vector.size()-1));
            elems.emplace_back(vector[random_pos]);
            vector.erase(vector.begin() + random_pos);
        }

        elems.emplace_back(*vector.begin());
        vector = elems;
    }